

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsErrorCode
WScriptJsrt::LoadModuleFromString(LPCSTR fileName,LPCSTR fileContent,LPCSTR fullName,bool isFile)

{
  JsErrorCode JVar1;
  iterator iVar2;
  LPCSTR pCVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  mapped_type *fullDirNarrow;
  mapped_type *ppvVar6;
  pointer ppVar7;
  PAL_FILE *pPVar8;
  LPCWSTR pWVar9;
  size_t sVar10;
  mapped_type *pmVar11;
  uint local_134;
  _Base_ptr local_d8;
  JsValueRef pvStack_c8;
  uint fileContentLength;
  JsValueRef errorObject;
  JsErrorCode jsErrorCode;
  JsValueRef local_98;
  JsValueRef specifier;
  JsErrorCode local_88;
  JsErrorCode errorCode;
  allocator local_71;
  string local_70 [32];
  _Self local_50;
  iterator moduleRecordEntry;
  LPCSTR moduleRecordKey;
  JsModuleRecord requestModule;
  DWORD_PTR dwSourceCookie;
  _Base_ptr p_Stack_28;
  bool isFile_local;
  LPCSTR fullName_local;
  LPCSTR fileContent_local;
  LPCSTR fileName_local;
  
  dwSourceCookie._7_1_ = isFile;
  p_Stack_28 = (_Base_ptr)fullName;
  fullName_local = fileContent;
  fileContent_local = fileName;
  requestModule = (JsModuleRecord)GetNextSourceContext();
  moduleRecordKey = (LPCSTR)0x0;
  if (p_Stack_28 == (_Base_ptr)0x0) {
    local_d8 = (_Base_ptr)fileContent_local;
  }
  else {
    local_d8 = p_Stack_28;
  }
  moduleRecordEntry._M_node = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,(char *)local_d8,&local_71);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
       ::find(&moduleRecordMap_abi_cxx11_,(key_type *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_88 = JsNoError;
  specifier = (JsValueRef)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
              ::end(&moduleRecordMap_abi_cxx11_);
  bVar5 = std::operator==(&local_50,(_Self *)&specifier);
  p_Var4 = p_Stack_28;
  if (bVar5) {
    local_98 = (JsValueRef)0x0;
    if (((dwSourceCookie._7_1_ & 1) != 0) && (p_Stack_28 != (_Base_ptr)0x0)) {
      sVar10 = strlen((char *)p_Stack_28);
      local_88 = ChakraRTInterface::JsCreateString((char *)p_Var4,sVar10,&local_98);
    }
    if (local_88 == JsNoError) {
      local_88 = ChakraRTInterface::JsInitializeModuleRecord
                           ((JsModuleRecord)0x0,local_98,&moduleRecordKey);
    }
    p_Var4 = p_Stack_28;
    if (local_88 == JsNoError) {
      if (p_Stack_28 != (_Base_ptr)0x0) {
        fullDirNarrow =
             std::
             map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&moduleDirMap_abi_cxx11_,&moduleRecordKey);
        GetDir((LPCSTR)p_Var4,fullDirNarrow);
      }
      pCVar3 = moduleRecordKey;
      iVar2._M_node = moduleRecordEntry._M_node;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&jsErrorCode,(char *)iVar2._M_node,(allocator *)((long)&errorObject + 7))
      ;
      ppvVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                ::operator[](&moduleRecordMap_abi_cxx11_,(key_type *)&jsErrorCode);
      *ppvVar6 = pCVar3;
      std::__cxx11::string::~string((string *)&jsErrorCode);
      std::allocator<char>::~allocator((allocator<char> *)((long)&errorObject + 7));
      pmVar11 = std::
                map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                ::operator[](&moduleErrMap,&moduleRecordKey);
      *pmVar11 = RootModule;
    }
  }
  else {
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>
             ::operator->(&local_50);
    moduleRecordKey = (LPCSTR)ppVar7->second;
  }
  errorObject._0_4_ = local_88;
  if (local_88 == JsNoError) {
    pvStack_c8 = (JsValueRef)0x0;
    if (fullName_local == (LPCSTR)0x0) {
      local_134 = 0;
    }
    else {
      sVar10 = strlen(fullName_local);
      local_134 = (uint)sVar10;
    }
    local_88 = ChakraRTInterface::JsParseModuleSource
                         (moduleRecordKey,(JsSourceContext)requestModule,(byte *)fullName_local,
                          local_134,JsParseModuleSourceFlags_DataIsUTF8,&stack0xffffffffffffff38);
    if ((((local_88 == JsNoError) || (pvStack_c8 == (JsValueRef)0x0)) ||
        (fullName_local == (LPCSTR)0x0)) ||
       (((HostConfigFlags::flags.IgnoreScriptErrorCode & 1U) != 0 ||
        (pmVar11 = std::
                   map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                   ::operator[](&moduleErrMap,&moduleRecordKey), *pmVar11 != RootModule)))) {
      fileName_local._4_4_ = JsNoError;
    }
    else {
      ChakraRTInterface::JsSetException(pvStack_c8);
      pmVar11 = std::
                map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                ::operator[](&moduleErrMap,&moduleRecordKey);
      *pmVar11 = ErroredModule;
      fileName_local._4_4_ = local_88;
    }
  }
  else {
    pPVar8 = PAL_get_stderr(0);
    JVar1 = (JsErrorCode)errorObject;
    pWVar9 = Helpers::JsErrorCodeToString((JsErrorCode)errorObject);
    PAL_fwprintf(pPVar8,L"ERROR: errorCode failed. JsErrorCode=0x%x (%s)\n",(ulong)JVar1,pWVar9);
    pPVar8 = PAL_get_stderr(0);
    PAL_fflush(pPVar8);
    fileName_local._4_4_ = (JsErrorCode)errorObject;
  }
  return fileName_local._4_4_;
}

Assistant:

JsErrorCode WScriptJsrt::LoadModuleFromString(LPCSTR fileName, LPCSTR fileContent, LPCSTR fullName, bool isFile)
{
    DWORD_PTR dwSourceCookie = WScriptJsrt::GetNextSourceContext();
    JsModuleRecord requestModule = JS_INVALID_REFERENCE;
    LPCSTR moduleRecordKey = fullName ? fullName : fileName;
    auto moduleRecordEntry = moduleRecordMap.find(std::string(moduleRecordKey));
    JsErrorCode errorCode = JsNoError;

    // we need to create a new moduleRecord if the specifier (fileName) is not found;
    // otherwise we'll use the old one.
    if (moduleRecordEntry == moduleRecordMap.end())
    {
        JsValueRef specifier = nullptr;
        if (isFile && fullName)
        {
            errorCode = ChakraRTInterface::JsCreateString(
                fullName, strlen(fullName), &specifier);
        }
        if (errorCode == JsNoError)
        {
            errorCode = ChakraRTInterface::JsInitializeModuleRecord(
                nullptr, specifier, &requestModule);
        }
        if (errorCode == JsNoError)
        {
            if (fullName)
            {
                GetDir(fullName, &moduleDirMap[requestModule]);
            }

            moduleRecordMap[std::string(moduleRecordKey)] = requestModule;
            moduleErrMap[requestModule] = RootModule;
        }
    }
    else
    {
        requestModule = moduleRecordEntry->second;
    }
    IfJsrtErrorFailLogAndRetErrorCode(errorCode);
    JsValueRef errorObject = JS_INVALID_REFERENCE;

    // ParseModuleSource is sync, while additional fetch & evaluation are async.
    unsigned int fileContentLength = (fileContent == nullptr) ? 0 : (unsigned int)strlen(fileContent);
 
    errorCode = ChakraRTInterface::JsParseModuleSource(requestModule, dwSourceCookie, (LPBYTE)fileContent,
        fileContentLength, JsParseModuleSourceFlags_DataIsUTF8, &errorObject);
    if ((errorCode != JsNoError) && errorObject != JS_INVALID_REFERENCE && fileContent != nullptr && !HostConfigFlags::flags.IgnoreScriptErrorCode && moduleErrMap[requestModule] == RootModule)
    {
        ChakraRTInterface::JsSetException(errorObject);
        moduleErrMap[requestModule] = ErroredModule;
        return errorCode;
    }
    return JsNoError;
}